

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-context.c
# Opt level: O0

wchar_t context_menu_object(object *obj)

{
  loc_conflict grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  loc_conflict grid_03;
  region orig_area;
  region orig_area_00;
  undefined8 uVar1;
  _Bool _Var2;
  char cVar3;
  uchar uVar4;
  wchar_t mode_00;
  cmd_code lookup_cmd;
  size_t sVar5;
  command *pcVar6;
  square_conflict *psVar7;
  char *pcVar8;
  _Bool local_169;
  _Bool local_119;
  command_conflict *gc;
  menu_row_validity_t valid_5;
  menu_row_validity_t valid_4;
  menu_row_validity_t valid_3;
  menu_row_validity_t valid_2;
  menu_row_validity_t valid_1;
  menu_row_validity_t valid;
  uchar cmdkey;
  wchar_t mode;
  undefined4 uStack_cc;
  _Bool allowed;
  region area;
  textblock *tb;
  char header [120];
  char *labels;
  undefined1 local_30 [4];
  wchar_t selected;
  region r;
  menu *m;
  object *obj_local;
  
  memset(&mode,0,0x10);
  mode_00 = (wchar_t)(((player->opts).opt[1] & 1U) != 0);
  r._8_8_ = menu_dynamic_new();
  if (((menu *)r._8_8_ == (menu *)0x0) || (obj == (object *)0x0)) {
    obj_local._4_4_ = L'\0';
  }
  else {
    object_desc((char *)&tb,0x78,obj,0x40,player);
    header._112_8_ = string_make("abcdefghijklmnopqrstuvwxyz");
    *(undefined8 *)(r._8_8_ + 0x18) = header._112_8_;
    menu_dynamic_add_label((menu *)r._8_8_,"Inspect",'I',0x45a,(char *)header._112_8_);
    _Var2 = obj_can_browse(obj);
    if (_Var2) {
      _Var2 = obj_can_cast_from(obj);
      if ((_Var2) && (_Var2 = player_can_cast(player,false), _Var2)) {
        uVar4 = cmd_lookup_key_unktrl(CMD_CAST,mode_00);
        menu_dynamic_add_label_valid
                  ((menu *)r._8_8_,"Cast",uVar4,0x1d,(char *)header._112_8_,MN_ROW_VALID);
      }
      _Var2 = obj_can_study(obj);
      if ((_Var2) && (_Var2 = player_can_study(player,false), _Var2)) {
        uVar4 = cmd_lookup_key_unktrl(CMD_STUDY,mode_00);
        menu_dynamic_add_label_valid
                  ((menu *)r._8_8_,"Study",uVar4,0x1c,(char *)header._112_8_,MN_ROW_VALID);
      }
      _Var2 = player_can_read(player,false);
      if (_Var2) {
        uVar4 = cmd_lookup_key_unktrl(CMD_BROWSE_SPELL,mode_00);
        menu_dynamic_add_label_valid
                  ((menu *)r._8_8_,"Browse",uVar4,0x1b,(char *)header._112_8_,MN_ROW_VALID);
      }
    }
    else {
      _Var2 = obj_is_useable(obj);
      if (_Var2) {
        _Var2 = tval_is_wand(obj);
        if (_Var2) {
          _Var2 = obj_has_charges(obj);
          uVar4 = cmd_lookup_key_unktrl(CMD_USE_WAND,mode_00);
          menu_dynamic_add_label_valid
                    ((menu *)r._8_8_,"Aim",uVar4,0x1f,(char *)header._112_8_,(uint)_Var2);
        }
        else {
          _Var2 = tval_is_rod(obj);
          if (_Var2) {
            _Var2 = obj_can_zap(obj);
            uVar4 = cmd_lookup_key_unktrl(CMD_USE_ROD,mode_00);
            menu_dynamic_add_label_valid
                      ((menu *)r._8_8_,"Zap",uVar4,0x20,(char *)header._112_8_,(uint)_Var2);
          }
          else {
            _Var2 = tval_is_staff(obj);
            if (_Var2) {
              _Var2 = obj_has_charges(obj);
              uVar4 = cmd_lookup_key_unktrl(CMD_USE_STAFF,mode_00);
              menu_dynamic_add_label_valid
                        ((menu *)r._8_8_,"Use",uVar4,0x1e,(char *)header._112_8_,(uint)_Var2);
            }
            else {
              _Var2 = tval_is_scroll(obj);
              if (_Var2) {
                _Var2 = player_can_read(player,false);
                uVar4 = cmd_lookup_key_unktrl(CMD_READ_SCROLL,mode_00);
                menu_dynamic_add_label_valid
                          ((menu *)r._8_8_,"Read",uVar4,0x24,(char *)header._112_8_,(uint)_Var2);
              }
              else {
                _Var2 = tval_is_potion(obj);
                if (_Var2) {
                  uVar4 = cmd_lookup_key_unktrl(CMD_QUAFF,mode_00);
                  menu_dynamic_add_label_valid
                            ((menu *)r._8_8_,"Quaff",uVar4,0x23,(char *)header._112_8_,MN_ROW_VALID)
                  ;
                }
                else {
                  _Var2 = tval_is_edible(obj);
                  if (_Var2) {
                    uVar4 = cmd_lookup_key_unktrl(CMD_EAT,mode_00);
                    menu_dynamic_add_label_valid
                              ((menu *)r._8_8_,"Eat",uVar4,0x22,(char *)header._112_8_,MN_ROW_VALID)
                    ;
                  }
                  else {
                    _Var2 = obj_is_activatable(obj);
                    if (_Var2) {
                      _Var2 = object_is_equipped(player->body,obj);
                      local_119 = false;
                      if (_Var2) {
                        local_119 = obj_can_activate(obj);
                      }
                      uVar4 = cmd_lookup_key_unktrl(CMD_ACTIVATE,mode_00);
                      menu_dynamic_add_label_valid
                                ((menu *)r._8_8_,"Activate",uVar4,0x21,(char *)header._112_8_,
                                 (uint)(local_119 != false));
                    }
                    else {
                      _Var2 = obj_can_fire(obj);
                      if (_Var2) {
                        uVar4 = cmd_lookup_key_unktrl(CMD_FIRE,mode_00);
                        menu_dynamic_add_label_valid
                                  ((menu *)r._8_8_,"Fire",uVar4,0x27,(char *)header._112_8_,
                                   MN_ROW_VALID);
                      }
                      else {
                        uVar4 = cmd_lookup_key_unktrl(CMD_USE,mode_00);
                        menu_dynamic_add_label_valid
                                  ((menu *)r._8_8_,"Use",uVar4,0x26,(char *)header._112_8_,
                                   MN_ROW_VALID);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    _Var2 = obj_can_refill(obj);
    if (_Var2) {
      uVar4 = cmd_lookup_key_unktrl(CMD_REFILL,mode_00);
      menu_dynamic_add_label_valid
                ((menu *)r._8_8_,"Refill",uVar4,0x25,(char *)header._112_8_,MN_ROW_VALID);
    }
    _Var2 = object_is_equipped(player->body,obj);
    if ((_Var2) && (_Var2 = obj_can_takeoff(obj), _Var2)) {
      uVar4 = cmd_lookup_key_unktrl(CMD_TAKEOFF,mode_00);
      menu_dynamic_add_label_valid
                ((menu *)r._8_8_,"Take off",uVar4,0x18,(char *)header._112_8_,MN_ROW_VALID);
    }
    else {
      _Var2 = object_is_equipped(player->body,obj);
      if ((!_Var2) && (_Var2 = obj_can_wear(obj), _Var2)) {
        uVar4 = cmd_lookup_key_unktrl(CMD_WIELD,mode_00);
        menu_dynamic_add_label_valid
                  ((menu *)r._8_8_,"Equip",uVar4,0x19,(char *)header._112_8_,MN_ROW_VALID);
      }
    }
    _Var2 = object_is_carried(player,obj);
    if (_Var2) {
      grid.x = (player->grid).x;
      grid.y = (player->grid).y;
      _Var2 = square_isshop((chunk *)cave,grid);
      if (_Var2) {
        grid_00.x = (player->grid).x;
        grid_00.y = (player->grid).y;
        psVar7 = square((chunk *)cave,grid_00);
        if (psVar7->feat == '\x0e') {
          uVar4 = cmd_lookup_key_unktrl(CMD_DROP,mode_00);
          menu_dynamic_add_label_valid
                    ((menu *)r._8_8_,"Drop",uVar4,0x1a,(char *)header._112_8_,MN_ROW_VALID);
          if (1 < obj->number) {
            cVar3 = 'A';
            if (mode_00 == L'\0') {
              cVar3 = 'D';
            }
            menu_dynamic_add_label((menu *)r._8_8_,"Drop All",cVar3,0x45b,(char *)header._112_8_);
          }
        }
        else {
          _Var2 = store_will_buy_tester(obj);
          if (_Var2) {
            uVar4 = cmd_lookup_key_unktrl(CMD_DROP,mode_00);
            menu_dynamic_add_label_valid
                      ((menu *)r._8_8_,"Sell",uVar4,0x1a,(char *)header._112_8_,MN_ROW_VALID);
          }
        }
      }
      else {
        uVar4 = cmd_lookup_key_unktrl(CMD_DROP,mode_00);
        menu_dynamic_add_label_valid
                  ((menu *)r._8_8_,"Drop",uVar4,0x1a,(char *)header._112_8_,MN_ROW_VALID);
        if (1 < obj->number) {
          cVar3 = 'A';
          if (mode_00 == L'\0') {
            cVar3 = 'D';
          }
          menu_dynamic_add_label((menu *)r._8_8_,"Drop All",cVar3,0x45b,(char *)header._112_8_);
        }
      }
    }
    else {
      _Var2 = inven_carry_okay(obj);
      uVar4 = cmd_lookup_key_unktrl(CMD_PICKUP,mode_00);
      menu_dynamic_add_label_valid
                ((menu *)r._8_8_,"Pick up",uVar4,0x29,(char *)header._112_8_,(uint)_Var2);
    }
    _Var2 = obj_can_throw(obj);
    if (_Var2) {
      uVar4 = cmd_lookup_key_unktrl(CMD_THROW,mode_00);
      menu_dynamic_add_label_valid
                ((menu *)r._8_8_,"Throw",uVar4,0x28,(char *)header._112_8_,MN_ROW_VALID);
    }
    uVar4 = cmd_lookup_key_unktrl(CMD_INSCRIBE,mode_00);
    menu_dynamic_add_label_valid
              ((menu *)r._8_8_,"Inscribe",uVar4,0x15,(char *)header._112_8_,MN_ROW_VALID);
    _Var2 = obj_has_inscrip(obj);
    if (_Var2) {
      uVar4 = cmd_lookup_key_unktrl(CMD_UNINSCRIBE,mode_00);
      menu_dynamic_add_label_valid
                ((menu *)r._8_8_,"Uninscribe",uVar4,0x16,(char *)header._112_8_,MN_ROW_VALID);
    }
    uVar4 = cmd_lookup_key_unktrl(CMD_IGNORE,mode_00);
    uVar1 = r._8_8_;
    _Var2 = object_is_ignored(obj);
    pcVar8 = "Ignore";
    if (_Var2) {
      pcVar8 = "Unignore";
    }
    menu_dynamic_add_label_valid
              ((menu *)uVar1,pcVar8,uVar4,0x2b,(char *)header._112_8_,MN_ROW_VALID);
    sVar5 = menu_dynamic_longest_entry((menu *)r._8_8_);
    r.col = (int)sVar5 + 5;
    local_30 = (undefined1  [4])(~r.col + Term->wid);
    selected = L'\x01';
    r.row = *(int *)(r._8_8_ + 0x70);
    area.col = -2 - r.col;
    msg_flag = false;
    screen_save();
    area._8_8_ = object_info(obj,OINFO_NONE);
    object_desc((char *)&tb,0x78,obj,0x43,player);
    uVar1 = area._8_8_;
    pcVar8 = format("%s",&tb);
    orig_area.width = area.col;
    orig_area.col = mode;
    orig_area.row = uStack_cc;
    orig_area.page_rows = area.row;
    textui_textblock_place((textblock *)uVar1,orig_area,pcVar8);
    textblock_free((textblock *)area._8_8_);
    menu_layout((menu *)r._8_8_,(region *)local_30);
    region_erase_bordered((region *)local_30);
    pcVar8 = format("(Enter to select, ESC) Command for %s:",&tb);
    prt(pcVar8,L'\0',L'\0');
    lookup_cmd = menu_dynamic_select((menu *)r._8_8_);
    menu_dynamic_free((menu *)r._8_8_);
    string_free((char *)header._112_8_);
    screen_load();
    uVar4 = cmd_lookup_key(lookup_cmd,mode_00);
    if (lookup_cmd == ~CMD_NULL) {
      obj_local._4_4_ = L'\x03';
    }
    else {
      if (((lookup_cmd - CMD_INSCRIBE < 2) || (lookup_cmd - CMD_TAKEOFF < 0x12)) ||
         (lookup_cmd == CMD_IGNORE)) {
        _Var2 = key_confirm_command(uVar4);
        local_169 = false;
        if (_Var2) {
          local_169 = get_item_allow(obj,uVar4,lookup_cmd,false);
        }
        cmdkey = local_169;
      }
      else {
        if (lookup_cmd == 0x45a) {
          area._8_8_ = object_info(obj,OINFO_NONE);
          object_desc((char *)&tb,0x78,obj,0x43,player);
          uVar1 = area._8_8_;
          pcVar8 = format("%s",&tb);
          orig_area_00.width = area.col;
          orig_area_00.col = mode;
          orig_area_00.row = uStack_cc;
          orig_area_00.page_rows = area.row;
          textui_textblock_show((textblock *)uVar1,orig_area_00,pcVar8);
          textblock_free((textblock *)area._8_8_);
          return L'\x02';
        }
        if (lookup_cmd == 0x45b) {
          grid_01.x = (player->grid).x;
          grid_01.y = (player->grid).y;
          _Var2 = square_isshop((chunk *)cave,grid_01);
          if (_Var2) {
            cmdq_push(CMD_STASH);
          }
          else {
            cmdq_push(CMD_DROP);
          }
          pcVar6 = cmdq_peek();
          cmd_set_arg_item(pcVar6,"item",obj);
          pcVar6 = cmdq_peek();
          cmd_set_arg_number(pcVar6,"quantity",(uint)obj->number);
          return L'\x01';
        }
        bell();
        cmdkey = '\0';
      }
      if (cmdkey == '\0') {
        obj_local._4_4_ = L'\x01';
      }
      else {
        if (lookup_cmd == CMD_IGNORE) {
          textui_cmd_ignore_menu(obj);
        }
        else {
          if (lookup_cmd == CMD_BROWSE_SPELL) {
            textui_book_browse(obj);
            return L'\x02';
          }
          if (lookup_cmd == CMD_STUDY) {
            cmdq_push(CMD_STUDY);
            pcVar6 = cmdq_peek();
            cmd_set_arg_item(pcVar6,"item",obj);
          }
          else if (lookup_cmd == CMD_CAST) {
            _Var2 = obj_can_cast_from(obj);
            if (_Var2) {
              cmdq_push(CMD_CAST);
              pcVar6 = cmdq_peek();
              cmd_set_arg_item(pcVar6,"book",obj);
            }
          }
          else {
            cmdq_push(lookup_cmd);
            pcVar6 = cmdq_peek();
            cmd_set_arg_item(pcVar6,"item",obj);
            if ((lookup_cmd == CMD_DROP) &&
               (grid_02.x = (player->grid).x, grid_02.y = (player->grid).y,
               _Var2 = square_isshop((chunk *)cave,grid_02), _Var2)) {
              pcVar6 = cmdq_peek();
              grid_03.x = (player->grid).x;
              grid_03.y = (player->grid).y;
              psVar7 = square((chunk *)cave,grid_03);
              if (psVar7->feat == '\x0e') {
                pcVar6->code = CMD_STASH;
              }
              else {
                pcVar6->code = CMD_SELL;
              }
            }
          }
        }
        obj_local._4_4_ = L'\x01';
      }
    }
  }
  return obj_local._4_4_;
}

Assistant:

int context_menu_object(struct object *obj)
{
	struct menu *m;
	region r;
	int selected;
	char *labels;
	char header[120];

	textblock *tb;
	region area = { 0, 0, 0, 0 };

	bool allowed = true;
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;
	unsigned char cmdkey;

	m = menu_dynamic_new();
	if (!m || !obj)
		return 0;

	object_desc(header, sizeof(header), obj, ODESC_PREFIX | ODESC_BASE,
		player);

	labels = string_make(lower_case);
	m->selections = labels;

	/* 'I' is used for inspect in both keymaps. */
	menu_dynamic_add_label(m, "Inspect", 'I', MENU_VALUE_INSPECT, labels);

	if (obj_can_browse(obj)) {
		if (obj_can_cast_from(obj) && player_can_cast(player, false))
			ADD_LABEL("Cast", CMD_CAST, MN_ROW_VALID);

		if (obj_can_study(obj) && player_can_study(player, false))
			ADD_LABEL("Study", CMD_STUDY, MN_ROW_VALID);

		if (player_can_read(player, false))
			ADD_LABEL("Browse", CMD_BROWSE_SPELL, MN_ROW_VALID);
	} else if (obj_is_useable(obj)) {
		if (tval_is_wand(obj)) {
			menu_row_validity_t valid = (obj_has_charges(obj)) ?
				MN_ROW_VALID : MN_ROW_INVALID;
			ADD_LABEL("Aim", CMD_USE_WAND, valid);
		} else if (tval_is_rod(obj)) {
			menu_row_validity_t valid = (obj_can_zap(obj)) ?
				MN_ROW_VALID : MN_ROW_INVALID;
			ADD_LABEL("Zap", CMD_USE_ROD, valid);
		} else if (tval_is_staff(obj)) {
			menu_row_validity_t valid = (obj_has_charges(obj)) ?
				MN_ROW_VALID : MN_ROW_INVALID;
			ADD_LABEL("Use", CMD_USE_STAFF, valid);
		} else if (tval_is_scroll(obj)) {
			menu_row_validity_t valid = (player_can_read(player, false)) ?
				MN_ROW_VALID : MN_ROW_INVALID;
			ADD_LABEL("Read", CMD_READ_SCROLL, valid);
		} else if (tval_is_potion(obj)) {
			ADD_LABEL("Quaff", CMD_QUAFF, MN_ROW_VALID);
		} else if (tval_is_edible(obj)) {
			ADD_LABEL("Eat", CMD_EAT, MN_ROW_VALID);
		} else if (obj_is_activatable(obj)) {
			menu_row_validity_t valid = (object_is_equipped(player->body, obj)
										 && obj_can_activate(obj)) ?
				MN_ROW_VALID : MN_ROW_INVALID;
			ADD_LABEL("Activate", CMD_ACTIVATE, valid);
		} else if (obj_can_fire(obj)) {
			ADD_LABEL("Fire", CMD_FIRE, MN_ROW_VALID);
		} else {
			ADD_LABEL("Use", CMD_USE, MN_ROW_VALID);
		}
	}

	if (obj_can_refill(obj))
		ADD_LABEL("Refill", CMD_REFILL, MN_ROW_VALID);

	if (object_is_equipped(player->body, obj) && obj_can_takeoff(obj)) {
		ADD_LABEL("Take off", CMD_TAKEOFF, MN_ROW_VALID);
	} else if (!object_is_equipped(player->body, obj) && obj_can_wear(obj)) {
		ADD_LABEL("Equip", CMD_WIELD, MN_ROW_VALID);
	}

	if (object_is_carried(player, obj)) {
		if (!square_isshop(cave, player->grid)) {
			ADD_LABEL("Drop", CMD_DROP, MN_ROW_VALID);

			if (obj->number > 1) {
				/* 'D' is used for ignore in rogue keymap, so swap letters. */
				cmdkey = (mode == KEYMAP_MODE_ORIG) ? 'D' : 'A';
				menu_dynamic_add_label(m, "Drop All", cmdkey,
									   MENU_VALUE_DROP_ALL, labels);
			}
		} else if (square(cave, player->grid)->feat == FEAT_HOME) {
			ADD_LABEL("Drop", CMD_DROP, MN_ROW_VALID);

			if (obj->number > 1) {
				/* 'D' is used for ignore in rogue keymap, so swap letters. */
				cmdkey = (mode == KEYMAP_MODE_ORIG) ? 'D' : 'A';
				menu_dynamic_add_label(m, "Drop All", cmdkey,
									   MENU_VALUE_DROP_ALL, labels);
			}
		} else if (store_will_buy_tester(obj)) {
			ADD_LABEL("Sell", CMD_DROP, MN_ROW_VALID);
		}
	} else {
		menu_row_validity_t valid = (inven_carry_okay(obj)) ?
			MN_ROW_VALID : MN_ROW_INVALID;
		ADD_LABEL("Pick up", CMD_PICKUP, valid);
	}

	if (obj_can_throw(obj)) {
		ADD_LABEL("Throw", CMD_THROW, MN_ROW_VALID);
	}

	ADD_LABEL("Inscribe", CMD_INSCRIBE, MN_ROW_VALID);

	if (obj_has_inscrip(obj))
		ADD_LABEL("Uninscribe", CMD_UNINSCRIBE, MN_ROW_VALID);

	ADD_LABEL( (object_is_ignored(obj) ? "Unignore" : "Ignore"), CMD_IGNORE,
			   MN_ROW_VALID);

	/* work out display region */
	r.width = (int)menu_dynamic_longest_entry(m) + 3 + 2; /* +3 for tag,
														   * 2 for pad */
	r.col = Term->wid - r.width - 1;
	r.row = 1;
	r.page_rows = m->count;

	area.width = -(r.width + 2);

	/* Hack -- no flush needed */
	msg_flag = false;
	screen_save();

	/* Display info */
	tb = object_info(obj, OINFO_NONE);
	object_desc(header, sizeof(header), obj, ODESC_PREFIX | ODESC_FULL,
		player);

	textui_textblock_place(tb, area, format("%s", header));
	textblock_free(tb);

	menu_layout(m, &r);
	region_erase_bordered(&r);

	prt(format("(Enter to select, ESC) Command for %s:", header), 0, 0);
	selected = menu_dynamic_select(m);

	menu_dynamic_free(m);
	string_free(labels);

	screen_load();

	cmdkey = cmd_lookup_key(selected, mode);

	switch (selected) {
		case -1:
			/* User cancelled the menu. */
			return 3;

		case MENU_VALUE_INSPECT:
			/* copied from textui_obj_examine */
			/* Display info */
			tb = object_info(obj, OINFO_NONE);
			object_desc(header, sizeof(header), obj,
				ODESC_PREFIX | ODESC_FULL, player);

			textui_textblock_show(tb, area, format("%s", header));
			textblock_free(tb);
			return 2;

		case MENU_VALUE_DROP_ALL:
			/* Drop entire stack without confirmation. */
			if (square_isshop(cave, player->grid))
				cmdq_push(CMD_STASH);
			else
				cmdq_push(CMD_DROP);
			cmd_set_arg_item(cmdq_peek(), "item", obj);
			cmd_set_arg_number(cmdq_peek(), "quantity", obj->number);
			return 1;

		case CMD_BROWSE_SPELL:
		case CMD_STUDY:
		case CMD_CAST:
		case CMD_IGNORE:
		case CMD_WIELD:
		case CMD_TAKEOFF:
		case CMD_INSCRIBE:
		case CMD_UNINSCRIBE:
		case CMD_PICKUP:
		case CMD_DROP:
		case CMD_REFILL:
		case CMD_THROW:
		case CMD_USE_WAND:
		case CMD_USE_ROD:
		case CMD_USE_STAFF:
		case CMD_READ_SCROLL:
		case CMD_QUAFF:
		case CMD_EAT:
		case CMD_ACTIVATE:
		case CMD_FIRE:
		case CMD_USE:
			/* Check for inscriptions that trigger confirmation. */
			allowed = key_confirm_command(cmdkey) &&
				get_item_allow(obj, cmdkey, selected, false);
			break;
		default:
			/* Invalid command; prevent anything from happening. */
			bell();
			allowed = false;
			break;
	}

	if (!allowed)
		return 1;

	if (selected == CMD_IGNORE) {
		/* ignore or unignore the item */
		textui_cmd_ignore_menu(obj);
	} else if (selected == CMD_BROWSE_SPELL) {
		/* browse a spellbook */
		/* copied from textui_spell_browse */
		textui_book_browse(obj);
		return 2;
	} else if (selected == CMD_STUDY) {
		cmdq_push(CMD_STUDY);
		cmd_set_arg_item(cmdq_peek(), "item", obj);
	} else if (selected == CMD_CAST) {
		if (obj_can_cast_from(obj)) {
			cmdq_push(CMD_CAST);
			cmd_set_arg_item(cmdq_peek(), "book", obj);
		}
	} else {
		cmdq_push(selected);
		cmd_set_arg_item(cmdq_peek(), "item", obj);

		/* If we're in a store, change the "drop" command to "stash". */
		if (selected == CMD_DROP &&
			square_isshop(cave, player->grid)) {
			struct command *gc = cmdq_peek();
			if (square(cave, player->grid)->feat == FEAT_HOME)
				gc->code = CMD_STASH;
			else
				gc->code = CMD_SELL;
		}
	}

	return 1;
}